

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O1

int __thiscall smf::Binasc::writeToBinary(Binasc *this,ostream *out,istream *input)

{
  int iVar1;
  size_t sVar2;
  int lineCount;
  char inputLine [1024];
  string local_458;
  char local_438 [1032];
  
  memset(local_438,0,0x400);
  std::istream::getline((char *)input,(long)local_438,'\0');
  lineCount = 1;
  while( true ) {
    if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) != 0) {
      return 1;
    }
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    sVar2 = strlen(local_438);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_458,local_438,local_438 + sVar2);
    iVar1 = processLine(this,out,&local_458,lineCount);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p);
    }
    if (iVar1 == 0) break;
    std::istream::getline((char *)input,(long)local_438,'\0');
    lineCount = lineCount + 1;
  }
  return 0;
}

Assistant:

int Binasc::writeToBinary(std::ostream& out, std::istream& input) {
	char inputLine[1024] = {0};    // current line being processed
	int  lineNum = 0;              // current line number

	input.getline(inputLine, 1024, '\n');
	lineNum++;
	while (!input.eof()) {
		int status = processLine(out, inputLine, lineNum);
		if (!status) {
			return 0;
		}
		input.getline(inputLine, 1024, '\n');
		lineNum++;
	}
	return 1;
}